

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QLine>::emplace<QLine>(QPodArrayOps<QLine> *this,qsizetype i,QLine *args)

{
  QLine **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QPoint QVar4;
  QPoint QVar5;
  QLine *pQVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QLine>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_003bca34:
    QVar4 = args->pt1;
    QVar5 = args->pt2;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QLine>).size != 0);
    QArrayDataPointer<QLine>::detachAndGrow
              (&this->super_QArrayDataPointer<QLine>,where,1,(QLine **)0x0,
               (QArrayDataPointer<QLine> *)0x0);
    pQVar6 = createHole(this,where,i,1);
    pQVar6->pt1 = QVar4;
    pQVar6->pt2 = QVar5;
  }
  else {
    if (((this->super_QArrayDataPointer<QLine>).size == i) &&
       (pQVar6 = (this->super_QArrayDataPointer<QLine>).ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar6 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
       i)) {
      QVar4 = args->pt2;
      pQVar6 = pQVar6 + i;
      pQVar6->pt1 = args->pt1;
      pQVar6->pt2 = QVar4;
    }
    else {
      if ((i != 0) ||
         (pQVar6 = (this->super_QArrayDataPointer<QLine>).ptr,
         (QLine *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pQVar6)) goto LAB_003bca34;
      QVar4 = args->pt2;
      pQVar6[-1].pt1 = args->pt1;
      pQVar6[-1].pt2 = QVar4;
      ppQVar1 = &(this->super_QArrayDataPointer<QLine>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QLine>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }